

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

Duration * google::protobuf::operator-=(Duration *d1,Duration *d2)

{
  Duration local_38;
  
  util::anon_unknown_1::CreateNormalized<google::protobuf::Duration>
            (&local_38,d1->seconds_ - d2->seconds_,(long)d1->nanos_ - (long)d2->nanos_);
  Duration::operator=(d1,&local_38);
  Duration::~Duration(&local_38);
  return d1;
}

Assistant:

Duration& operator-=(Duration& d1, const Duration& d2) {  // NOLINT
  d1 = CreateNormalized<Duration>(d1.seconds() - d2.seconds(),
                                  d1.nanos() - d2.nanos());
  return d1;
}